

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86MOVSXD(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,
             int shift)

{
  uint uVar1;
  
  *stream = (8 < (int)dst) << 2 | (8 < (int)index) * '\x02' | 8 < (int)base | 0x48;
  stream[1] = 'c';
  uVar1 = encodeAddress(stream + 2,index,multiplier,base,shift,(int)regCode[dst]);
  return (uVar1 + (int)(stream + 2)) - (int)stream;
}

Assistant:

int x86MOVSXD(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	(void)size;

	unsigned char *start = stream;

	stream += encodeRex(stream, true, dst, index, base);
	*stream++ = 0x63;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}